

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

void big_file_dtype_format(char *buffer,char *dtype,void *data,char *fmt)

{
  char *__format;
  char *pcVar1;
  double dVar2;
  char ndtype [8];
  char ndtype2 [8];
  char converted [128];
  char cStack_c8;
  undefined4 local_c7;
  char local_c0 [8];
  float local_b8;
  float fStack_b4;
  double local_b0;
  
  pcVar1 = &cStack_c8;
  _dtype_normalize(local_c0,dtype);
  local_c0[0] = '=';
  _dtype_normalize(&cStack_c8,local_c0);
  dtype_convert_simple(&local_b8,&cStack_c8,data,dtype,1);
  if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3161) {
    pcVar1 = "%c";
  }
  else {
    if (local_c7._2_1_ != '\0' || (short)local_c7 != 0x3162) {
      if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3869) {
        __format = "%ld";
LAB_00106ec8:
        if (fmt != (char *)0x0) {
          __format = fmt;
        }
        pcVar1 = (char *)CONCAT44(fStack_b4,local_b8);
LAB_00106ed1:
        sprintf(buffer,__format,pcVar1);
        return;
      }
      if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3469) {
        pcVar1 = "%d";
      }
      else {
        if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3875) {
          __format = "%lu";
          goto LAB_00106ec8;
        }
        if (local_c7._2_1_ != '\0' || (short)local_c7 != 0x3475) {
          if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3866) {
            pcVar1 = "%g";
            if (fmt != (char *)0x0) {
              pcVar1 = fmt;
            }
            dVar2 = (double)CONCAT44(fStack_b4,local_b8);
LAB_00106f2b:
            sprintf(buffer,pcVar1,dVar2);
            return;
          }
          if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3466) {
            pcVar1 = "%g";
            if (fmt != (char *)0x0) {
              pcVar1 = fmt;
            }
            dVar2 = (double)local_b8;
            goto LAB_00106f2b;
          }
          if (local_c7._2_1_ == '\0' && (short)local_c7 == 0x3863) {
            pcVar1 = "%g+%gI";
            if (fmt != (char *)0x0) {
              pcVar1 = fmt;
            }
            dVar2 = (double)local_b8;
            local_b0 = (double)fStack_b4;
LAB_00106f6d:
            sprintf(buffer,pcVar1,dVar2,local_b0);
            return;
          }
          if (local_c7 == 0x363163) {
            pcVar1 = "%g+%gI";
            if (fmt != (char *)0x0) {
              pcVar1 = fmt;
            }
            dVar2 = (double)CONCAT44(fStack_b4,local_b8);
            goto LAB_00106f6d;
          }
          __format = "<%s>";
          goto LAB_00106ed1;
        }
        pcVar1 = "%u";
      }
      if (fmt != (char *)0x0) {
        pcVar1 = fmt;
      }
      goto LAB_00106e9a;
    }
    pcVar1 = "%d";
  }
  if (fmt != (char *)0x0) {
    pcVar1 = fmt;
  }
  local_b8 = (float)(int)local_b8._0_1_;
LAB_00106e9a:
  sprintf(buffer,pcVar1,(ulong)(uint)local_b8);
  return;
}

Assistant:

void
big_file_dtype_format(char * buffer, const char * dtype, const void * data, const char * fmt)
{
    char ndtype[8];
    char ndtype2[8];
    variant_t p;

    /* handle the endianness stuff in case it is not machine */
    char converted[128];

    _dtype_normalize(ndtype2, dtype);
    ndtype2[0] = '=';
    _dtype_normalize(ndtype, ndtype2);
    dtype_convert_simple(converted, ndtype, data, dtype, 1);

    p.v = converted;
#define FORMAT1(dtype, defaultfmt) \
    if(0 == strcmp(ndtype + 1, # dtype)) { \
        if(fmt == NULL) fmt = defaultfmt; \
        sprintf(buffer, fmt, *p.dtype); \
    } else
#define FORMAT2(dtype, defaultfmt) \
    if(0 == strcmp(ndtype + 1, # dtype)) { \
        if(fmt == NULL) fmt = defaultfmt; \
        sprintf(buffer, fmt, p.dtype->r, p.dtype->i); \
    } else

    FORMAT1(a1, "%c")
    FORMAT1(b1, "%d")
    FORMAT1(i8, "%ld")
    FORMAT1(i4, "%d")
    FORMAT1(u8, "%lu")
    FORMAT1(u4, "%u")
    FORMAT1(f8, "%g")
    FORMAT1(f4, "%g")
    FORMAT2(c8, "%g+%gI")
    FORMAT2(c16, "%g+%gI")
    {
        sprintf(buffer, "<%s>", ndtype);
    }
}